

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O3

void __thiscall
Address_ElementsSegwitAddressFromStringTest_Test::TestBody
          (Address_ElementsSegwitAddressFromStringTest_Test *this)

{
  bool bVar1;
  pointer __dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> params;
  Address address;
  AssertHelper local_358;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  string local_348;
  undefined1 local_328 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined1 local_308 [16];
  pointer local_2f8;
  pointer local_2e0;
  pointer local_2c8;
  TapBranch local_2b0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_238;
  Script local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_1b0;
  Address local_198;
  
  cfd::core::Address::Address(&local_198);
  local_328 = (undefined1  [8])&local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,
             "[{\"nettype\":\"Test\",\"p2pkh\":\"ff\",\"p2sh\":\"ff\",\"bech32\":\"dmy\"},{\"nettype\":\"elementsregtest\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"},]"
             ,"");
  cfd::core::AddressFormatData::ConvertListFromJson(&local_1b0,(string *)local_328);
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6","");
      cfd::core::Address::Address((Address *)local_328,&local_348,&local_1b0);
      cfd::core::Address::operator=(&local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch(&local_2b0);
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (pointer)0x0) {
        operator_delete(local_2f8);
      }
      if ((undefined1 *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2e2,
               "Expected: (address = Address(\"ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6\", params)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_328 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_328 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_328 + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_328,&local_198);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6\"",
             "address.GetAddress().c_str()","ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6",
             (char *)local_328);
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328);
  }
  if ((char)local_348._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_328);
    if ((undefined8 *)local_348._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_348._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2e4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_328 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_328 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_328 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_348._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 4;
  local_358.data_._0_4_ = local_198.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_328,"NetType::kElementsRegtest","address.GetNetType()",
             (NetType *)&local_348,(NetType *)&local_358);
  if (local_328[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2e6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 4;
  local_358.data_._0_4_ = local_198.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_328,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_358);
  if (local_328[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2ea,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = local_348._M_dataplus._M_p & 0xffffffff00000000;
  local_358.data_._0_4_ = local_198.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_328,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_348,(WitnessVersion *)&local_358);
  if (local_328[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2eb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity = 0;
  uVar3 = (long)local_198.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_198.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar3 == 0) {
    __dest = (pointer)0x0;
    sVar5 = 0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar3);
    sVar5 = (long)local_198.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_198.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_348.field_2._M_allocated_capacity = (size_type)(__dest + uVar3);
  local_348._M_dataplus._M_p = __dest;
  if (local_198.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_198.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_348._M_string_length = (size_type)__dest;
    memmove(__dest,local_198.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  local_348._M_string_length = (size_type)(__dest + sVar5);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_328,(ByteData *)&local_348);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (char *)local_328);
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328);
  }
  if (local_348._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_328);
    if (local_350.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2ed,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_328 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_328 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_328 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity = 0;
  uVar3 = (long)local_198.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_198.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar3 == 0) {
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    sVar5 = 0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(uVar3);
    sVar5 = (long)local_198.pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_198.pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_348.field_2._M_allocated_capacity = uVar3 + (long)paVar2;
  local_348._M_dataplus._M_p = (pointer)paVar2;
  if (local_198.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_198.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_348._M_string_length = (size_type)paVar2;
    memmove(paVar2,local_198.pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  local_348._M_string_length = (long)paVar2 + sVar5;
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_328,(Pubkey *)&local_348);
  pcVar4 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,"\"\"","address.GetPubkey().GetHex().c_str()","",
             (char *)local_328);
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_328);
    if (local_350.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2ee,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_328 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_328 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_328 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_328,&local_198.redeem_script_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_348,(Script *)local_328);
  pcVar4 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,"\"\"","address.GetScript().GetHex().c_str()","",
             local_348._M_dataplus._M_p);
  paVar2 = &local_348.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  cfd::core::Script::~Script((Script *)local_328);
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_328);
    if (local_350.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2ef,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_328 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_328 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_328 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_348._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,
                 "ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4","");
      cfd::core::Address::Address((Address *)local_328,&local_348,&local_1b0);
      cfd::core::Address::operator=(&local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch(&local_2b0);
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (pointer)0x0) {
        operator_delete(local_2f8);
      }
      if ((undefined1 *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2f1,
               "Expected: (address = Address(\"ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4\", params)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_328 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_328 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_328 + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_328,&local_198);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,
             "\"ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4\"",
             "address.GetAddress().c_str()",
             "ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4",(char *)local_328);
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328);
  }
  if ((char)local_348._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_328);
    if ((undefined8 *)local_348._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_348._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2f3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_328 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_328 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_328 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_348._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 4;
  local_358.data_._0_4_ = local_198.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_328,"NetType::kElementsRegtest","address.GetNetType()",
             (NetType *)&local_348,(NetType *)&local_358);
  if (local_328[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2f5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 3;
  local_358.data_._0_4_ = local_198.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_328,"AddressType::kP2wshAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_358);
  if (local_328[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2f9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = local_348._M_dataplus._M_p & 0xffffffff00000000;
  local_358.data_._0_4_ = local_198.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_328,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_348,(WitnessVersion *)&local_358);
  if (local_328[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2fa,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_1b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_198.format_data_);
  cfd::core::Script::~Script(&local_198.redeem_script_);
  local_198.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_006918c8;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_198.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_198.script_tree_.super_TapBranch);
  if (local_198.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.address_._M_dataplus._M_p != &local_198.address_.field_2) {
    operator_delete(local_198.address_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Address, ElementsSegwitAddressFromStringTest) {
  Address address;
  std::vector<AddressFormatData> params = AddressFormatData::ConvertListFromJson(
      "[{\"nettype\":\"Test\",\"p2pkh\":\"ff\",\"p2sh\":\"ff\",\"bech32\":\"dmy\"},"
      "{\"nettype\":\"elementsregtest\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"},]");

  EXPECT_NO_THROW((address = Address("ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6", params)));
  EXPECT_STREQ("ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6",
               address.GetAddress().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_EQ(NetType::kElementsRegtest, address.GetNetType());
#else
  EXPECT_EQ(NetType::kNetTypeNum, address.GetNetType());
#endif  // CFD_DISABLE_ELEMENTS
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4", params)));
  EXPECT_STREQ("ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4",
               address.GetAddress().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_EQ(NetType::kElementsRegtest, address.GetNetType());
#else
  EXPECT_EQ(NetType::kNetTypeNum, address.GetNetType());
#endif  // CFD_DISABLE_ELEMENTS
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
}